

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cinject_test_app.cpp
# Opt level: O3

int main(void)

{
  Container *pCVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  element_type *peVar3;
  element_type *peVar4;
  _Hash_node_base *p_Var5;
  element_type *peVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  long *plVar7;
  pointer psVar8;
  pointer psVar9;
  pointer psVar10;
  pointer psVar11;
  Container *pCVar12;
  type waterConsumers;
  type walkers;
  Container c;
  type runners;
  shared_ptr<IFlyer> flyer;
  shared_ptr<ISwimmer> swimmer;
  shared_ptr<ICrawler> crawler;
  shared_ptr<IJumper> jumper;
  shared_ptr<IRunner> runner;
  shared_ptr<IWalker> walter;
  type flyers;
  type swimmers;
  type crawlers;
  type jumpers;
  undefined1 local_200 [24];
  undefined1 local_1e8 [24];
  undefined1 local_1d0 [64];
  type local_190;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_178;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_170;
  undefined1 local_168 [24];
  __node_base local_150;
  undefined1 local_148 [24];
  __node_base local_130;
  undefined1 local_128 [24];
  __node_base local_110;
  type local_108;
  type local_f0;
  type local_d8;
  type local_c0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  code *local_98;
  code *local_90;
  ComponentBuilderBase<WaterPool> local_80;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_78;
  ComponentBuilderBase<Behavior> local_70;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_68;
  ComponentBuilderBase<Wings> local_60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  ComponentBuilderBase<Arms> local_50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  ComponentBuilderBase<Legs> local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  local_1d0._0_8_ = (Container *)0x0;
  local_1d0._8_8_ = local_1d0 + 0x38;
  local_1d0._16_8_ = (pointer)0x1;
  local_1d0._24_8_ = (pointer)0x0;
  local_1d0._32_8_ = 0;
  local_1d0._40_4_ = 1.0;
  local_1d0._48_8_ = 0;
  local_1d0._56_8_ = (__node_base_ptr)0x0;
  local_190.super__Vector_base<std::shared_ptr<IRunner>,_std::allocator<std::shared_ptr<IRunner>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_1d0;
  cinject::
  ComponentBuilderBase<IWalker,_IRunner,_IJumper,_ICrawler,_ISwimmer,_IWaterConsumer,_Human>::
  to<Human>((ComponentBuilderBase<IWalker,_IRunner,_IJumper,_ICrawler,_ISwimmer,_IWaterConsumer,_Human>
             *)local_1e8);
  *(code *)(local_1e8._0_8_ + 9) = (code)0x1;
  if ((Container *)local_1e8._8_8_ != (Container *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e8._8_8_);
  }
  local_190.super__Vector_base<std::shared_ptr<IRunner>,_std::allocator<std::shared_ptr<IRunner>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_1d0;
  cinject::ComponentBuilderBase<ICrawler,_IWaterConsumer,_Snake>::to<Snake>
            ((ComponentBuilderBase<ICrawler,_IWaterConsumer,_Snake> *)local_1e8);
  *(code *)(local_1e8._0_8_ + 9) = (code)0x1;
  if ((Container *)local_1e8._8_8_ != (Container *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e8._8_8_);
  }
  local_190.super__Vector_base<std::shared_ptr<IRunner>,_std::allocator<std::shared_ptr<IRunner>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_1d0;
  cinject::ComponentBuilderBase<IWalker,_ICrawler,_ISwimmer,_IWaterConsumer,_Turtle>::to<Turtle>
            ((ComponentBuilderBase<IWalker,_ICrawler,_ISwimmer,_IWaterConsumer,_Turtle> *)local_1e8)
  ;
  *(code *)(local_1e8._0_8_ + 9) = (code)0x1;
  if ((Container *)local_1e8._8_8_ != (Container *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e8._8_8_);
  }
  local_190.super__Vector_base<std::shared_ptr<IRunner>,_std::allocator<std::shared_ptr<IRunner>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_1d0;
  cinject::ComponentBuilderBase<IWalker,_IRunner,_IJumper,_IFlyer,_IWaterConsumer,_Bird>::to<Bird>
            ((ComponentBuilderBase<IWalker,_IRunner,_IJumper,_IFlyer,_IWaterConsumer,_Bird> *)
             local_1e8);
  *(code *)(local_1e8._0_8_ + 9) = (code)0x1;
  if ((Container *)local_1e8._8_8_ != (Container *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e8._8_8_);
  }
  local_1e8._0_8_ = (Container *)local_1d0;
  cinject::ComponentBuilderBase<Legs>::to<Legs>(&local_40);
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
  }
  local_1e8._0_8_ = (Container *)local_1d0;
  cinject::ComponentBuilderBase<Arms>::to<Arms>(&local_50);
  if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
  }
  local_1e8._0_8_ = (Container *)local_1d0;
  cinject::ComponentBuilderBase<Wings>::to<Wings>(&local_60);
  if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
  }
  local_a8 = 0;
  uStack_a0 = 0;
  local_90 = std::
             _Function_handler<std::shared_ptr<Behavior>_(cinject::InjectionContext_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mjirous[P]cinject/src/sample/cinject_test_app.cpp:228:45)>
             ::_M_invoke;
  local_98 = std::
             _Function_handler<std::shared_ptr<Behavior>_(cinject::InjectionContext_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mjirous[P]cinject/src/sample/cinject_test_app.cpp:228:45)>
             ::_M_manager;
  local_1e8._0_8_ = (Container *)local_1d0;
  cinject::ComponentBuilderBase<Behavior>::toFunction<Behavior>
            (&local_70,(FactoryMethodType *)local_1e8);
  if (local_68 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68);
  }
  if (local_98 != (code *)0x0) {
    (*local_98)(&local_a8,&local_a8,3);
  }
  this = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
  this->_M_use_count = 1;
  this->_M_weak_count = 1;
  this->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00147c60;
  *(undefined4 *)&this[1]._vptr__Sp_counted_base = 1000;
  if (__libc_single_threaded == '\0') {
    LOCK();
    this->_M_use_count = this->_M_use_count + 1;
    UNLOCK();
  }
  else {
    this->_M_use_count = 2;
  }
  local_1e8._0_8_ = (Container *)local_1d0;
  local_178 = this + 1;
  local_170 = this;
  cinject::ComponentBuilderBase<WaterPool>::toConstant<WaterPool>
            (&local_80,(shared_ptr<WaterPool> *)local_1e8);
  if (local_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78);
  }
  if (local_170 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_170);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Resolving IWalker",0x11)
  ;
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
  std::ostream::put(-0x18);
  std::ostream::flush();
  cinject::Container::get<IWalker>((Container *)(local_128 + 0x10),(InjectionContext *)local_1d0);
  (*(code *)**(undefined8 **)local_128._16_8_)();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Resolving IRunner",0x11)
  ;
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
  std::ostream::put(-0x18);
  std::ostream::flush();
  cinject::Container::get<IRunner>((Container *)local_128,(InjectionContext *)local_1d0);
  (*(code *)(*(Container **)local_128._0_8_)->parentContainer_)();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Resolving IJumper",0x11)
  ;
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
  std::ostream::put(-0x18);
  std::ostream::flush();
  cinject::Container::get<IJumper>((Container *)(local_148 + 0x10),(InjectionContext *)local_1d0);
  (*(code *)**(undefined8 **)local_148._16_8_)();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Resolving ICrawler",0x12);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
  std::ostream::put(-0x18);
  std::ostream::flush();
  cinject::Container::get<ICrawler>((Container *)local_148,(InjectionContext *)local_1d0);
  (*(code *)(*(Container **)local_148._0_8_)->parentContainer_)();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Resolving ISwimmer",0x12);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
  std::ostream::put(-0x18);
  std::ostream::flush();
  cinject::Container::get<ISwimmer>((Container *)(local_168 + 0x10),(InjectionContext *)local_1d0);
  (*(code *)**(undefined8 **)local_168._16_8_)();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Resolving IFlyer",0x10);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
  std::ostream::put(-0x18);
  std::ostream::flush();
  cinject::Container::get<IFlyer>((Container *)local_168,(InjectionContext *)local_1d0);
  (*(code *)(*(Container **)local_168._0_8_)->parentContainer_)();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Resolving all implementations of IWalker",0x28);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
  std::ostream::put(-0x18);
  std::ostream::flush();
  cinject::Container::get<std::vector<IWalker,std::allocator<IWalker>>>
            ((type *)local_1e8,(Container *)local_1d0,(InjectionContext *)0x0);
  for (pCVar12 = (Container *)local_1e8._0_8_; pCVar12 != (Container *)local_1e8._8_8_;
      pCVar12 = (Container *)&(pCVar12->registrations_)._M_h._M_bucket_count) {
    pCVar1 = pCVar12->parentContainer_;
    p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             (pCVar12->registrations_)._M_h._M_buckets;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      }
    }
    (*(code *)pCVar1->parentContainer_->parentContainer_)();
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Resolving all implementations of IRunner",0x28);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
  std::ostream::put(-0x18);
  std::ostream::flush();
  cinject::Container::get<std::vector<IRunner,std::allocator<IRunner>>>
            (&local_190,(Container *)local_1d0,(InjectionContext *)0x0);
  for (pCVar12 = (Container *)
                 local_190.
                 super__Vector_base<std::shared_ptr<IRunner>,_std::allocator<std::shared_ptr<IRunner>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      pCVar12 !=
      (Container *)
      local_190.
      super__Vector_base<std::shared_ptr<IRunner>,_std::allocator<std::shared_ptr<IRunner>_>_>.
      _M_impl.super__Vector_impl_data._M_finish;
      pCVar12 = (Container *)&(pCVar12->registrations_)._M_h._M_bucket_count) {
    pCVar1 = pCVar12->parentContainer_;
    p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             (pCVar12->registrations_)._M_h._M_buckets;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      }
    }
    (*(code *)pCVar1->parentContainer_->parentContainer_)();
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Resolving all implementations of IJumper",0x28);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
  std::ostream::put(-0x18);
  std::ostream::flush();
  cinject::Container::get<std::vector<IJumper,std::allocator<IJumper>>>
            (&local_c0,(Container *)local_1d0,(InjectionContext *)0x0);
  for (psVar8 = local_c0.
                super__Vector_base<std::shared_ptr<IJumper>,_std::allocator<std::shared_ptr<IJumper>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      psVar8 != local_c0.
                super__Vector_base<std::shared_ptr<IJumper>,_std::allocator<std::shared_ptr<IJumper>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; psVar8 = psVar8 + 1) {
    peVar3 = (psVar8->super___shared_ptr<IJumper,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    p_Var2 = (psVar8->super___shared_ptr<IJumper,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      }
    }
    (**peVar3->_vptr_IJumper)();
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Resolving all implementations of ICrawler",0x29);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
  std::ostream::put(-0x18);
  std::ostream::flush();
  cinject::Container::get<std::vector<ICrawler,std::allocator<ICrawler>>>
            (&local_d8,(Container *)local_1d0,(InjectionContext *)0x0);
  for (psVar9 = local_d8.
                super__Vector_base<std::shared_ptr<ICrawler>,_std::allocator<std::shared_ptr<ICrawler>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      psVar9 != local_d8.
                super__Vector_base<std::shared_ptr<ICrawler>,_std::allocator<std::shared_ptr<ICrawler>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; psVar9 = psVar9 + 1) {
    peVar4 = (psVar9->super___shared_ptr<ICrawler,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    p_Var2 = (psVar9->super___shared_ptr<ICrawler,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      }
    }
    (**peVar4->_vptr_ICrawler)();
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Resolving all implementations of ISwimmer",0x29);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
  std::ostream::put(-0x18);
  std::ostream::flush();
  cinject::Container::get<std::vector<ISwimmer,std::allocator<ISwimmer>>>
            (&local_f0,(Container *)local_1d0,(InjectionContext *)0x0);
  for (psVar10 = local_f0.
                 super__Vector_base<std::shared_ptr<ISwimmer>,_std::allocator<std::shared_ptr<ISwimmer>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      psVar10 !=
      local_f0.
      super__Vector_base<std::shared_ptr<ISwimmer>,_std::allocator<std::shared_ptr<ISwimmer>_>_>.
      _M_impl.super__Vector_impl_data._M_finish; psVar10 = psVar10 + 1) {
    p_Var5 = (_Hash_node_base *)
             (psVar10->super___shared_ptr<ISwimmer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    p_Var2 = (psVar10->super___shared_ptr<ISwimmer,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      }
    }
    (*(code *)p_Var5->_M_nxt->_M_nxt)();
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Resolving all implementations of IFlyer",0x27);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
  std::ostream::put(-0x18);
  std::ostream::flush();
  cinject::Container::get<std::vector<IFlyer,std::allocator<IFlyer>>>
            (&local_108,(Container *)local_1d0,(InjectionContext *)0x0);
  for (psVar11 = local_108.
                 super__Vector_base<std::shared_ptr<IFlyer>,_std::allocator<std::shared_ptr<IFlyer>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      psVar11 !=
      local_108.
      super__Vector_base<std::shared_ptr<IFlyer>,_std::allocator<std::shared_ptr<IFlyer>_>_>._M_impl
      .super__Vector_impl_data._M_finish; psVar11 = psVar11 + 1) {
    peVar6 = (psVar11->super___shared_ptr<IFlyer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    p_Var2 = (psVar11->super___shared_ptr<IFlyer,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      }
    }
    (**peVar6->_vptr_IFlyer)();
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Dumping all entity behavior",0x1b);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
  std::ostream::put(-0x18);
  std::ostream::flush();
  cinject::Container::get<Human>((Container *)local_200,(InjectionContext *)local_1d0);
  Behavior::act((Behavior *)
                (((Container *)(local_200._0_8_ + 0x40))->registrations_)._M_h._M_bucket_count);
  if ((Container *)local_200._8_8_ != (Container *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_200._8_8_);
  }
  cinject::Container::get<Snake>((Container *)local_200,(InjectionContext *)local_1d0);
  Behavior::act((Behavior *)
                (((unordered_map<cinject::component_type,_std::vector<std::shared_ptr<cinject::IInstanceRetriever>,_std::allocator<std::shared_ptr<cinject::IInstanceRetriever>_>_>,_cinject::component_type_hash,_std::equal_to<cinject::component_type>,_std::allocator<std::pair<const_cinject::component_type,_std::vector<std::shared_ptr<cinject::IInstanceRetriever>,_std::allocator<std::shared_ptr<cinject::IInstanceRetriever>_>_>_>_>_>
                   *)(local_200._0_8_ + 8))->_M_h)._M_element_count);
  if ((Container *)local_200._8_8_ != (Container *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_200._8_8_);
  }
  cinject::Container::get<Turtle>((Container *)local_200,(InjectionContext *)local_1d0);
  Behavior::act((Behavior *)
                (((unordered_map<cinject::component_type,_std::vector<std::shared_ptr<cinject::IInstanceRetriever>,_std::allocator<std::shared_ptr<cinject::IInstanceRetriever>_>_>,_cinject::component_type_hash,_std::equal_to<cinject::component_type>,_std::allocator<std::pair<const_cinject::component_type,_std::vector<std::shared_ptr<cinject::IInstanceRetriever>,_std::allocator<std::shared_ptr<cinject::IInstanceRetriever>_>_>_>_>_>
                   *)(local_200._0_8_ + 8))->_M_h)._M_rehash_policy._M_next_resize);
  if ((Container *)local_200._8_8_ != (Container *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_200._8_8_);
  }
  cinject::Container::get<Bird>((Container *)local_200,(InjectionContext *)local_1d0);
  Behavior::act((Behavior *)
                (((Container *)(local_200._0_8_ + 0x40))->registrations_)._M_h._M_buckets);
  if ((Container *)local_200._8_8_ != (Container *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_200._8_8_);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Moving with all limbs",0x15);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
  std::ostream::put(-0x18);
  std::ostream::flush();
  cinject::Container::get<Human>((Container *)local_200,(InjectionContext *)local_1d0);
  Legs::move((Legs *)(((unordered_map<cinject::component_type,_std::vector<std::shared_ptr<cinject::IInstanceRetriever>,_std::allocator<std::shared_ptr<cinject::IInstanceRetriever>_>_>,_cinject::component_type_hash,_std::equal_to<cinject::component_type>,_std::allocator<std::pair<const_cinject::component_type,_std::vector<std::shared_ptr<cinject::IInstanceRetriever>,_std::allocator<std::shared_ptr<cinject::IInstanceRetriever>_>_>_>_>_>
                        *)(local_200._0_8_ + 8))->_M_h)._M_rehash_policy._M_next_resize);
  if ((Container *)local_200._8_8_ != (Container *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_200._8_8_);
  }
  cinject::Container::get<Human>((Container *)local_200,(InjectionContext *)local_1d0);
  Arms::move((Arms *)((Container *)(local_200._0_8_ + 0x40))->parentContainer_);
  if ((Container *)local_200._8_8_ != (Container *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_200._8_8_);
  }
  cinject::Container::get<Snake>((Container *)local_200,(InjectionContext *)local_1d0);
  Legs::move((Legs *)(((unordered_map<cinject::component_type,_std::vector<std::shared_ptr<cinject::IInstanceRetriever>,_std::allocator<std::shared_ptr<cinject::IInstanceRetriever>_>_>,_cinject::component_type_hash,_std::equal_to<cinject::component_type>,_std::allocator<std::pair<const_cinject::component_type,_std::vector<std::shared_ptr<cinject::IInstanceRetriever>,_std::allocator<std::shared_ptr<cinject::IInstanceRetriever>_>_>_>_>_>
                        *)(local_200._0_8_ + 8))->_M_h)._M_bucket_count);
  if ((Container *)local_200._8_8_ != (Container *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_200._8_8_);
  }
  cinject::Container::get<Turtle>((Container *)local_200,(InjectionContext *)local_1d0);
  Legs::move((Legs *)(((unordered_map<cinject::component_type,_std::vector<std::shared_ptr<cinject::IInstanceRetriever>,_std::allocator<std::shared_ptr<cinject::IInstanceRetriever>_>_>,_cinject::component_type_hash,_std::equal_to<cinject::component_type>,_std::allocator<std::pair<const_cinject::component_type,_std::vector<std::shared_ptr<cinject::IInstanceRetriever>,_std::allocator<std::shared_ptr<cinject::IInstanceRetriever>_>_>_>_>_>
                        *)(local_200._0_8_ + 8))->_M_h)._M_element_count);
  if ((Container *)local_200._8_8_ != (Container *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_200._8_8_);
  }
  cinject::Container::get<Bird>((Container *)local_200,(InjectionContext *)local_1d0);
  Legs::move(*(Legs **)&(((unordered_map<cinject::component_type,_std::vector<std::shared_ptr<cinject::IInstanceRetriever>,_std::allocator<std::shared_ptr<cinject::IInstanceRetriever>_>_>,_cinject::component_type_hash,_std::equal_to<cinject::component_type>,_std::allocator<std::pair<const_cinject::component_type,_std::vector<std::shared_ptr<cinject::IInstanceRetriever>,_std::allocator<std::shared_ptr<cinject::IInstanceRetriever>_>_>_>_>_>
                           *)(local_200._0_8_ + 8))->_M_h)._M_rehash_policy);
  if ((Container *)local_200._8_8_ != (Container *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_200._8_8_);
  }
  cinject::Container::get<Bird>((Container *)local_200,(InjectionContext *)local_1d0);
  Wings::move((Wings *)(((unordered_map<cinject::component_type,_std::vector<std::shared_ptr<cinject::IInstanceRetriever>,_std::allocator<std::shared_ptr<cinject::IInstanceRetriever>_>_>,_cinject::component_type_hash,_std::equal_to<cinject::component_type>,_std::allocator<std::pair<const_cinject::component_type,_std::vector<std::shared_ptr<cinject::IInstanceRetriever>,_std::allocator<std::shared_ptr<cinject::IInstanceRetriever>_>_>_>_>_>
                          *)(local_200._0_8_ + 8))->_M_h)._M_single_bucket);
  if ((Container *)local_200._8_8_ != (Container *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_200._8_8_);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Make all entities consume water",0x1f);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
  std::ostream::put(-0x18);
  std::ostream::flush();
  cinject::Container::get<std::vector<IWaterConsumer,std::allocator<IWaterConsumer>>>
            ((type *)local_200,(Container *)local_1d0,(InjectionContext *)0x0);
  for (pCVar12 = (Container *)local_200._0_8_; pCVar12 != (Container *)local_200._8_8_;
      pCVar12 = (Container *)&(pCVar12->registrations_)._M_h._M_bucket_count) {
    pCVar1 = pCVar12->parentContainer_;
    p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             (pCVar12->registrations_)._M_h._M_buckets;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      }
    }
    (*(code *)pCVar1->parentContainer_->parentContainer_)();
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Remaining water in water pool: ",0x1f);
  plVar7 = (long *)std::ostream::operator<<
                             ((ostream *)&std::cout,*(int *)&this[1]._vptr__Sp_counted_base);
  std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
  std::ostream::put((char)plVar7);
  std::ostream::flush();
  std::vector<std::shared_ptr<IWaterConsumer>,_std::allocator<std::shared_ptr<IWaterConsumer>_>_>::
  ~vector((vector<std::shared_ptr<IWaterConsumer>,_std::allocator<std::shared_ptr<IWaterConsumer>_>_>
           *)local_200);
  std::vector<std::shared_ptr<IFlyer>,_std::allocator<std::shared_ptr<IFlyer>_>_>::~vector
            (&local_108);
  std::vector<std::shared_ptr<ISwimmer>,_std::allocator<std::shared_ptr<ISwimmer>_>_>::~vector
            (&local_f0);
  std::vector<std::shared_ptr<ICrawler>,_std::allocator<std::shared_ptr<ICrawler>_>_>::~vector
            (&local_d8);
  std::vector<std::shared_ptr<IJumper>,_std::allocator<std::shared_ptr<IJumper>_>_>::~vector
            (&local_c0);
  std::vector<std::shared_ptr<IRunner>,_std::allocator<std::shared_ptr<IRunner>_>_>::~vector
            (&local_190);
  std::vector<std::shared_ptr<IWalker>,_std::allocator<std::shared_ptr<IWalker>_>_>::~vector
            ((vector<std::shared_ptr<IWalker>,_std::allocator<std::shared_ptr<IWalker>_>_> *)
             local_1e8);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._8_8_);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_150._M_nxt !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_150._M_nxt);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148._8_8_);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_130._M_nxt !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_130._M_nxt);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._8_8_);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_110._M_nxt !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_110._M_nxt);
  }
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
  std::
  _Hashtable<cinject::component_type,_std::pair<const_cinject::component_type,_std::vector<std::shared_ptr<cinject::IInstanceRetriever>,_std::allocator<std::shared_ptr<cinject::IInstanceRetriever>_>_>_>,_std::allocator<std::pair<const_cinject::component_type,_std::vector<std::shared_ptr<cinject::IInstanceRetriever>,_std::allocator<std::shared_ptr<cinject::IInstanceRetriever>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<cinject::component_type>,_cinject::component_type_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<cinject::component_type,_std::pair<const_cinject::component_type,_std::vector<std::shared_ptr<cinject::IInstanceRetriever>,_std::allocator<std::shared_ptr<cinject::IInstanceRetriever>_>_>_>,_std::allocator<std::pair<const_cinject::component_type,_std::vector<std::shared_ptr<cinject::IInstanceRetriever>,_std::allocator<std::shared_ptr<cinject::IInstanceRetriever>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<cinject::component_type>,_cinject::component_type_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)(local_1d0 + 8));
  return 0;
}

Assistant:

int main()
{
    Container c;

    // Singletons
    c.bind<IWalker, IRunner, IJumper, ICrawler, ISwimmer, IWaterConsumer, Human>().to<Human>().inSingletonScope();
    c.bind<ICrawler, IWaterConsumer, Snake>().to<Snake>().inSingletonScope();
    c.bind<IWalker, ICrawler, ISwimmer, IWaterConsumer, Turtle>().to<Turtle>().inSingletonScope();
    c.bind<IWalker, IRunner, IJumper, IFlyer, IWaterConsumer, Bird>().to<Bird>().inSingletonScope();

    // Not singletons
    c.bind<Legs>().toSelf();
    c.bind<Arms>().toSelf();
    c.bind<Wings>().to<Wings>(); //Same as toSelf

    // Manual creation of object. Not singleton, but it could be by calling InSingleTonScope
    c.bind<Behavior>().toFunction<Behavior>([](InjectionContext* ctx)
    {
        const std::string name = ctx->getRequester().name();
        return std::make_shared<Behavior>(name);
    });

    // Manually created instance
    auto waterPool = std::make_shared<WaterPool>(1000);
    c.bind<WaterPool>().toConstant(waterPool);


    std::cout << "Resolving IWalker" << std::endl;
    std::shared_ptr<IWalker> walter = c.get<IWalker>();
    walter->walk();

    std::cout << "Resolving IRunner" << std::endl;
    std::shared_ptr<IRunner> runner = c.get<IRunner>();
    runner->run();

    std::cout << "Resolving IJumper" << std::endl;
    std::shared_ptr<IJumper> jumper = c.get<IJumper>();
    jumper->jump();

    std::cout << "Resolving ICrawler" << std::endl;
    std::shared_ptr<ICrawler> crawler = c.get<ICrawler>();
    crawler->crawl();

    std::cout << "Resolving ISwimmer" << std::endl;
    std::shared_ptr<ISwimmer> swimmer = c.get<ISwimmer>();
    swimmer->swim();

    std::cout << "Resolving IFlyer" << std::endl;
    std::shared_ptr<IFlyer> flyer = c.get<IFlyer>();
    flyer->fly();




    std::cout << "Resolving all implementations of IWalker" << std::endl;
    auto walkers = c.get<std::vector<IWalker>>();

    for (std::shared_ptr<IWalker> instance : walkers)
    {
        instance->walk();
    }

    std::cout << "Resolving all implementations of IRunner" << std::endl;
    auto runners = c.get<std::vector<IRunner>>();

    for (std::shared_ptr<IRunner> instance : runners)
    {
        instance->run();
    }

    std::cout << "Resolving all implementations of IJumper" << std::endl;
    auto jumpers = c.get<std::vector<IJumper>>();

    for (std::shared_ptr<IJumper> instance : jumpers)
    {
        instance->jump();
    }

    std::cout << "Resolving all implementations of ICrawler" << std::endl;
    auto crawlers = c.get<std::vector<ICrawler>>();

    for (std::shared_ptr<ICrawler> instance : crawlers)
    {
        instance->crawl();
    }

    std::cout << "Resolving all implementations of ISwimmer" << std::endl;
    auto swimmers = c.get<std::vector<ISwimmer>>();

    for (std::shared_ptr<ISwimmer> instance : swimmers)
    {
        instance->swim();
    }

    std::cout << "Resolving all implementations of IFlyer" << std::endl;
    auto flyers = c.get<std::vector<IFlyer>>();

    for (std::shared_ptr<IFlyer> instance : flyers)
    {
        instance->fly();
    }


    std::cout << "Dumping all entity behavior" << std::endl;
    c.get<Human>()->behavior->act();
    c.get<Snake>()->behavior->act();
    c.get<Turtle>()->behavior->act();
    c.get<Bird>()->behavior->act();

    std::cout << "Moving with all limbs" << std::endl;
    c.get<Human>()->legs->move();
    c.get<Human>()->arms->move();
    c.get<Snake>()->legs->move();
    c.get<Turtle>()->legs->move();
    c.get<Bird>()->legs->move();
    c.get<Bird>()->wings->move();


    std::cout << "Make all entities consume water" << std::endl;
    auto waterConsumers = c.get<std::vector<IWaterConsumer>>();

    for (std::shared_ptr<IWaterConsumer> instance : waterConsumers)
    {
        instance->consumeWater();
    }

    std::cout << "Remaining water in water pool: " << waterPool->remainingWater() << std::endl;

    return 0;
}